

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O2

int duckdb::Comparators::TemplatedCompareVal<duckdb::interval_t>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  bool bVar1;
  uint uVar2;
  interval_t local_28;
  interval_t local_18;
  
  local_18._0_8_ = *(undefined8 *)*left_ptr;
  local_18.micros = *(int64_t *)(*left_ptr + 8);
  local_28._0_8_ = *(undefined8 *)*right_ptr;
  local_28.micros = *(int64_t *)(*right_ptr + 8);
  bVar1 = interval_t::operator==(&local_18,&local_28);
  uVar2 = 0;
  if (!bVar1) {
    bVar1 = interval_t::operator>(&local_28,&local_18);
    uVar2 = -(uint)bVar1 | 1;
  }
  return uVar2;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}